

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pk0,secp256k1_xonly_pubkey *pk1)

{
  int iVar1;
  int local_7c;
  secp256k1_xonly_pubkey *psStack_78;
  int i;
  secp256k1_xonly_pubkey *pk [2];
  uchar out [2] [32];
  secp256k1_xonly_pubkey *pk1_local;
  secp256k1_xonly_pubkey *pk0_local;
  secp256k1_context *ctx_local;
  
  psStack_78 = pk0;
  pk[0] = pk1;
  for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
    iVar1 = secp256k1_xonly_pubkey_serialize
                      (ctx,out[(long)local_7c + -1] + 0x18,
                       *(secp256k1_xonly_pubkey **)(out[-1] + (long)local_7c * 8 + 8));
    if (iVar1 == 0) {
      memset(out[(long)local_7c + -1] + 0x18,0,0x20);
    }
  }
  iVar1 = secp256k1_memcmp_var(pk + 1,out[0] + 0x18,0x20);
  return iVar1;
}

Assistant:

int secp256k1_xonly_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_xonly_pubkey* pk0, const secp256k1_xonly_pubkey* pk1) {
    unsigned char out[2][32];
    const secp256k1_xonly_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pk0; pk[1] = pk1;
    for (i = 0; i < 2; i++) {
        /* If the public key is NULL or invalid, xonly_pubkey_serialize will
         * call the illegal_callback and return 0. In that case we will
         * serialize the key as all zeros which is less than any valid public
         * key. This results in consistent comparisons even if NULL or invalid
         * pubkeys are involved and prevents edge cases such as sorting
         * algorithms that use this function and do not terminate as a
         * result. */
        if (!secp256k1_xonly_pubkey_serialize(ctx, out[i], pk[i])) {
            /* Note that xonly_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[1]));
}